

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bijective_hash.hpp
# Opt level: O2

void __thiscall
poplar::bijective_hash::split_mix_hasher::show_stats(split_mix_hasher *this,ostream *os,int n)

{
  string indent;
  unsigned_long local_40;
  string local_38;
  
  get_indent_abi_cxx11_(&local_38,(poplar *)(ulong)(uint)n,n);
  show_stat<char[17]>(os,&local_38,"name",(char (*) [17])"split_mix_hasher");
  local_40 = (this->univ_size_).mask_ + 1;
  show_stat<unsigned_long>(os,&local_38,"size",&local_40);
  local_40 = (unsigned_long)(this->univ_size_).bits_;
  show_stat<unsigned_long>(os,&local_38,"bits",&local_40);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void show_stats(std::ostream& os, int n = 0) const {
        auto indent = get_indent(n);
        show_stat(os, indent, "name", "split_mix_hasher");
        show_stat(os, indent, "size", size());
        show_stat(os, indent, "bits", bits());
    }